

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O1

void __thiscall OpenMD::ZConstraintForceModifier::updateZPos(ZConstraintForceModifier *this)

{
  double dVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (this->fixedZMols_).
           super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->fixedZMols_) {
    dVar1 = this->zconsGap_;
    do {
      p_Var2[1]._M_prev = (_List_node_base *)((double)p_Var2[1]._M_prev + dVar1);
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->fixedZMols_);
  }
  return;
}

Assistant:

void ZConstraintForceModifier::updateZPos() {
    std::list<ZconstraintMol>::iterator i;
    for (i = fixedZMols_.begin(); i != fixedZMols_.end(); ++i) {
      i->param.zTargetPos += zconsGap_;
    }
  }